

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O1

char * __thiscall
adios2::format::BP5Serializer::BuildArrayBlockCountName
          (BP5Serializer *this,char *base_name,int type,int element_size)

{
  size_t sVar1;
  char *__s;
  
  sVar1 = strlen(base_name);
  __s = (char *)malloc(sVar1 + 0x1e);
  snprintf(__s,sVar1 + 0x1e,"%s%d_%d_","BPG",(ulong)(uint)element_size,(ulong)(uint)type);
  strcat(__s,base_name);
  sVar1 = strlen(__s);
  builtin_strncpy(__s + sVar1,"BlockCount",0xb);
  return __s;
}

Assistant:

char *BP5Serializer::BuildArrayBlockCountName(const char *base_name, const int type,
                                              const int element_size)
{
    const char *Prefix = NamePrefix(ShapeID::GlobalArray);
    size_t Len = strlen(base_name) + 3 + strlen(Prefix) + 24;
    char *Ret = (char *)malloc(Len);
    snprintf(Ret, Len, "%s%d_%d_", Prefix, element_size, type);
    strcat(Ret, base_name);
    strcat(Ret, "BlockCount");
    return Ret;
}